

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O1

word zzAddW(word *b,word *a,size_t n,word w)

{
  word wVar1;
  size_t sVar2;
  
  if (n != 0) {
    sVar2 = 0;
    do {
      wVar1 = w + a[sVar2];
      w = (word)CARRY8(w,a[sVar2]);
      b[sVar2] = wVar1;
      sVar2 = sVar2 + 1;
    } while (n != sVar2);
    return w;
  }
  return w;
}

Assistant:

word zzAddW(word b[], const word a[], size_t n, register word w)
{
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
#ifndef SAFE_FAST
		b[i] = a[i] + w, w = wordLess01(b[i], w);
#else
		b[i] = a[i] + w, w = b[i] < w;
#endif
	return w;
}